

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 *lhs;
  ImVec2 *rhs;
  TransformerLinLin *pTVar1;
  ImDrawVert *pIVar2;
  ImDrawIdx *pIVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  ImDrawIdx IVar7;
  uint uVar8;
  uint uVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  ImVec2 P22;
  ImVec2 P21;
  ImRect rect;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  ImVec2 local_68;
  ImVec2 local_60;
  ImRect local_58;
  undefined1 local_48 [16];
  undefined8 extraout_XMM0_Qb_01;
  
  pTVar1 = this->Transformer;
  local_58 = (ImRect)GetterXsYs<float>::operator()(this->Getter1,prim + 1);
  IVar10 = TransformerLinLin::operator()(pTVar1,(ImPlotPoint *)&local_58);
  local_78 = IVar10.x;
  fStack_74 = IVar10.y;
  pTVar1 = this->Transformer;
  local_60 = IVar10;
  local_58 = (ImRect)GetterXsYRef<float>::operator()(this->Getter2,prim + 1);
  IVar11 = TransformerLinLin::operator()(pTVar1,(ImPlotPoint *)&local_58);
  local_88 = IVar11.x;
  fStack_84 = IVar11.y;
  lhs = &this->P11;
  rhs = &this->P12;
  local_68 = IVar11;
  auVar13._0_8_ = ImMin(lhs,rhs);
  auVar13._8_8_ = extraout_XMM0_Qb_01;
  auVar14._8_8_ = extraout_XMM0_Qb;
  auVar14._0_4_ = IVar10.x;
  auVar14._4_4_ = IVar10.y;
  auVar14 = minps(auVar13,auVar14);
  auVar5._8_8_ = extraout_XMM0_Qb_00;
  auVar5._0_4_ = IVar11.x;
  auVar5._4_4_ = IVar11.y;
  local_48 = minps(auVar14,auVar5);
  IVar12 = ImMax(lhs,rhs);
  auVar5 = local_48;
  uVar8 = -(uint)(local_78 <= IVar12.x);
  uVar9 = -(uint)(fStack_74 <= IVar12.y);
  fVar15 = (float)(~uVar8 & (uint)local_78 | (uint)IVar12.x & uVar8);
  fVar16 = (float)(~uVar9 & (uint)fStack_74 | (uint)IVar12.y & uVar9);
  uVar8 = -(uint)(local_88 <= fVar15);
  uVar9 = -(uint)(fStack_84 <= fVar16);
  local_58.Max = (ImVec2)(CONCAT44(~uVar9 & (uint)fStack_84,~uVar8 & (uint)local_88) |
                         CONCAT44((uint)fVar16 & uVar9,(uint)fVar15 & uVar8));
  local_58.Min.x = (float)local_48._0_4_;
  local_58.Min.y = (float)local_48._4_4_;
  local_48 = auVar5;
  bVar6 = ImRect::Overlaps(cull_rect,&local_58);
  if (bVar6) {
    fVar15 = (this->P11).y;
    fVar16 = (this->P12).y;
    IVar12 = Intersection(lhs,&local_60,rhs,&local_68);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar2 = DrawList->_VtxWritePtr;
    pIVar2->col = this->Col;
    pIVar2[1].pos = IVar10;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar2 = DrawList->_VtxWritePtr;
    pIVar2[1].col = this->Col;
    pIVar2[2].pos = IVar12;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar2 = DrawList->_VtxWritePtr;
    pIVar2[2].col = this->Col;
    pIVar2[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar2 = DrawList->_VtxWritePtr;
    pIVar2[3].col = this->Col;
    pIVar2[4].pos = IVar11;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar2 = DrawList->_VtxWritePtr;
    pIVar2[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar2 + 5;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar3 = DrawList->_IdxWritePtr;
    IVar7 = (ImDrawIdx)uVar8;
    *pIVar3 = IVar7;
    uVar4 = -(ushort)(fVar15 < fVar16 && fStack_84 < fStack_74 ||
                     fVar16 < fVar15 && fStack_74 < fStack_84) & 1;
    pIVar3[1] = IVar7 + uVar4 + 1;
    pIVar3[2] = IVar7 + 3;
    pIVar3[3] = IVar7 + 1;
    pIVar3[4] = (uVar4 ^ 3) + IVar7;
    pIVar3[5] = IVar7 + 4;
    DrawList->_IdxWritePtr = pIVar3 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 5;
  }
  *lhs = IVar10;
  *rhs = IVar11;
  return bVar6;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }